

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

int Symbol_insert(symbol *data,char *key)

{
  symbol *psVar1;
  symbol *psVar2;
  int iVar3;
  uint uVar4;
  s_x2node *psVar5;
  s_x2node **ppsVar6;
  s_x2 *psVar7;
  int iVar8;
  int iVar9;
  s_x2node *psVar10;
  char cVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  char *pcVar16;
  s_x2node *psVar17;
  
  psVar7 = x2a;
  if (x2a == (s_x2 *)0x0) {
LAB_0010b51e:
    iVar8 = 0;
  }
  else {
    cVar11 = *key;
    if (cVar11 == '\0') {
      iVar8 = 0;
    }
    else {
      pcVar12 = key + 1;
      iVar8 = 0;
      do {
        iVar8 = (int)cVar11 + iVar8 * 0xd;
        cVar11 = *pcVar12;
        pcVar12 = pcVar12 + 1;
      } while (cVar11 != '\0');
    }
    iVar3 = x2a->size;
    lVar14 = (long)iVar3;
    for (psVar10 = x2a->ht[lVar14 - 1U & (long)iVar8]; psVar10 != (s_x2node *)0x0;
        psVar10 = psVar10->next) {
      iVar9 = strcmp(psVar10->key,key);
      if (iVar9 == 0) goto LAB_0010b51e;
    }
    uVar4 = psVar7->count;
    if (iVar3 <= (int)uVar4) {
      psVar10 = (s_x2node *)malloc(lVar14 * 0x50);
      if (psVar10 == (s_x2node *)0x0) goto LAB_0010b51e;
      psVar17 = psVar10 + lVar14 * 2;
      iVar9 = (int)(lVar14 * 2);
      if (0 < iVar3) {
        uVar13 = 1;
        if (1 < iVar9) {
          uVar13 = lVar14 * 2 & 0xffffffff;
        }
        memset(psVar17,0,uVar13 << 3);
      }
      if (0 < (int)uVar4) {
        uVar13 = 0;
        do {
          psVar5 = psVar7->tbl;
          pcVar12 = psVar5[uVar13].key;
          cVar11 = *pcVar12;
          uVar15 = 0;
          if (cVar11 != '\0') {
            uVar15 = 0;
            pcVar16 = pcVar12;
            do {
              pcVar16 = pcVar16 + 1;
              uVar15 = (int)cVar11 + uVar15 * 0xd;
              cVar11 = *pcVar16;
            } while (cVar11 != '\0');
          }
          uVar15 = uVar15 & iVar9 - 1U;
          psVar1 = (symbol *)(psVar10 + uVar13);
          if ((&psVar17->data)[(int)uVar15] != (symbol *)0x0) {
            (&psVar17->data)[(int)uVar15]->fallback = (symbol *)&psVar1->rule;
          }
          psVar2 = (symbol *)(&psVar17->data + (int)uVar15);
          psVar1->rule = (rule *)psVar2->name;
          *(char **)&psVar1->index = pcVar12;
          psVar1->name = (char *)psVar5[uVar13].data;
          psVar1->fallback = psVar2;
          psVar2->name = (char *)psVar1;
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar4);
      }
      free(psVar7->tbl);
      psVar7->size = iVar9;
      psVar7->count = uVar4;
      psVar7->tbl = psVar10;
      psVar7->ht = (s_x2node **)psVar17;
    }
    uVar13 = (long)psVar7->size - 1U & (long)iVar8;
    psVar17 = psVar7->tbl;
    iVar8 = psVar7->count;
    psVar7->count = iVar8 + 1;
    psVar10 = psVar17 + iVar8;
    psVar17[iVar8].key = key;
    psVar17[iVar8].data = data;
    ppsVar6 = psVar7->ht;
    if (ppsVar6[uVar13] != (s_x2node *)0x0) {
      ppsVar6[uVar13]->from = &psVar10->next;
    }
    psVar10->next = ppsVar6[uVar13];
    ppsVar6[uVar13] = psVar10;
    psVar10->from = psVar7->ht + uVar13;
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int Symbol_insert(struct symbol *data, const char *key)
{
  x2node *np;
  int h;
  int ph;

  if( x2a==0 ) return 0;
  ph = strhash(key);
  h = ph & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x2a->count>=x2a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x2 array;
    array.size = size = x2a->size*2;
    array.count = x2a->count;
    array.tbl = (x2node*)malloc(
      (sizeof(x2node) + sizeof(x2node*))*size );
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x2node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x2a->count; i++){
      x2node *oldnp, *newnp;
      oldnp = &(x2a->tbl[i]);
      h = strhash(oldnp->key) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x2a->tbl);
    *x2a = array;
  }
  /* Insert the new data */
  h = ph & (x2a->size-1);
  np = &(x2a->tbl[x2a->count++]);
  np->key = key;
  np->data = data;
  if( x2a->ht[h] ) x2a->ht[h]->from = &(np->next);
  np->next = x2a->ht[h];
  x2a->ht[h] = np;
  np->from = &(x2a->ht[h]);
  return 1;
}